

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2OrderParameter.cpp
# Opt level: O2

void __thiscall OpenMD::P2OrderParameter::writeP2(P2OrderParameter *this)

{
  double *pdVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  pointer pOVar5;
  Vector<double,_3U> *this_00;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double local_280;
  double local_278;
  Vector3d directorSum;
  double local_248;
  Vector<double,_3U> local_240;
  ofstream os;
  
  std::ofstream::ofstream
            ((ostream *)&os,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  std::operator<<((ostream *)&os,"#P2 Order parameter\n");
  poVar2 = std::operator<<((ostream *)&os,"#selection1: (");
  poVar2 = std::operator<<(poVar2,(string *)&this->selectionScript1_);
  std::operator<<(poVar2,")\t");
  if (this->doVect_ == false) {
    poVar2 = std::operator<<((ostream *)&os,"selection2: (");
    poVar2 = std::operator<<(poVar2,(string *)&this->selectionScript2_);
    std::operator<<(poVar2,")\n");
  }
  std::operator<<((ostream *)&os,"#p2\tdirector_x\tdirector_y\tdirector_z\tangle(degree)\n");
  local_248 = 0.0;
  this_00 = &local_240;
  Vector<double,_3U>::Vector(this_00,&local_248);
  Vector<double,_3U>::Vector(&directorSum.super_Vector<double,_3U>,this_00);
  pOVar5 = (this->orderParams_).
           super__Vector_base<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_278 = 0.0;
  lVar6 = 0;
  local_280 = 0.0;
  uVar7 = 0;
  while( true ) {
    lVar3 = (long)(this->orderParams_).
                  super__Vector_base<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar5;
    uVar4 = lVar3 / 0x28;
    if (uVar4 <= uVar7) break;
    pdVar1 = (double *)((long)(pOVar5->director).super_Vector<double,_3U>.data_ + lVar6 + -8);
    this_00 = (Vector<double,_3U> *)(pdVar1 + 1);
    local_278 = local_278 + *pdVar1;
    Vector<double,_3U>::add(&directorSum.super_Vector<double,_3U>,this_00);
    pOVar5 = (this->orderParams_).
             super__Vector_base<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_280 = local_280 + *(double *)((long)(&pOVar5->director + 1) + lVar6);
    uVar7 = uVar7 + 1;
    lVar6 = lVar6 + 0x28;
  }
  auVar9._8_4_ = (int)(uVar4 >> 0x20);
  auVar9._0_8_ = uVar4;
  auVar9._12_4_ = 0x45300000;
  Vector<double,_3U>::div(&directorSum.super_Vector<double,_3U>,(int)this_00,(int)(lVar3 % 0x28));
  lVar6 = ((long)(this->orderParams_).
                 super__Vector_base<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->orderParams_).
                super__Vector_base<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x28;
  poVar2 = std::ostream::_M_insert<double>
                     (local_278 /
                      ((auVar9._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)));
  std::operator<<(poVar2,"\t");
  poVar2 = std::ostream::_M_insert<double>(directorSum.super_Vector<double,_3U>.data_[0]);
  std::operator<<(poVar2,"\t");
  poVar2 = std::ostream::_M_insert<double>(directorSum.super_Vector<double,_3U>.data_[1]);
  std::operator<<(poVar2,"\t");
  poVar2 = std::ostream::_M_insert<double>(directorSum.super_Vector<double,_3U>.data_[2]);
  std::operator<<(poVar2,"\t");
  auVar8._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar8._0_8_ = lVar6;
  auVar8._12_4_ = 0x45300000;
  poVar2 = std::ostream::_M_insert<double>
                     (local_280 /
                      ((auVar8._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)));
  std::operator<<(poVar2,"\n");
  std::ofstream::~ofstream(&os);
  return;
}

Assistant:

void P2OrderParameter::writeP2() {
    ofstream os(getOutputFileName().c_str());
    os << "#P2 Order parameter\n";
    os << "#selection1: (" << selectionScript1_ << ")\t";
    if (!doVect_) { os << "selection2: (" << selectionScript2_ << ")\n"; }
    os << "#p2\tdirector_x\tdirector_y\tdirector_z\tangle(degree)\n";

    RealType p2Sum {};
    RealType angleSum {};
    Vector3d directorSum(0.0);

    for (size_t i = 0; i < orderParams_.size(); ++i) {
      p2Sum += orderParams_[i].p2;
      directorSum += orderParams_[i].director;
      angleSum += orderParams_[i].angle;
    }

    p2Sum /= orderParams_.size();
    directorSum /= orderParams_.size();
    angleSum /= orderParams_.size();

    os << p2Sum << "\t" << directorSum[0] << "\t" << directorSum[1] << "\t"
       << directorSum[2] << "\t" << angleSum << "\n";
  }